

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

parasail_matrix_t * parasail_matrix_from_file_internal(char *filename,int case_sensitive)

{
  ushort uVar1;
  long lVar2;
  ushort *puVar3;
  __int32_t *p_Var4;
  __int32_t *p_Var5;
  bool bVar6;
  size_t sVar7;
  char cVar8;
  int iVar9;
  parasail_file_t *pf;
  ushort **ppuVar10;
  char *__s;
  int *b;
  size_t sVar11;
  ulong extraout_RAX;
  __int32_t **pp_Var12;
  parasail_matrix_t *ppVar13;
  ulong extraout_RAX_00;
  long lVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  ulong uVar22;
  int val;
  int *local_b0;
  int *local_a0;
  size_t local_98;
  int local_88;
  int local_84;
  ulong local_80;
  int local_6c;
  size_t local_68;
  char *local_60;
  size_t local_58;
  ulong local_50;
  int local_48;
  char local_42 [10];
  ulong local_38;
  
  if (filename == (char *)0x0) {
    parasail_matrix_from_file_internal_cold_12();
    return (parasail_matrix_t *)0x0;
  }
  pf = parasail_open(filename);
  if (pf == (parasail_file_t *)0x0) {
    fprintf(_stderr,"parasail_matrix_from_file: parasail_open(%s) failed\n",filename);
    return (parasail_matrix_t *)0x0;
  }
  lVar2 = pf->size;
  local_60 = filename;
  local_48 = case_sensitive;
  if (lVar2 < 1) {
    parasail_close(pf);
    ppVar13 = parasail_matrix_from_file_internal((char *)pf,1);
    return ppVar13;
  }
  pcVar18 = pf->buf;
  bVar6 = true;
  local_84 = -0x80000000;
  local_88 = 0x7fffffff;
  local_b0 = (int *)0x0;
  uVar20 = 0;
  local_50 = 0;
  local_98 = 0;
  local_58 = 0;
  local_80 = 0;
  local_68 = 0;
  local_a0 = (int *)0x0;
  __s = (char *)0x0;
  lVar16 = 0;
  do {
    bVar21 = pcVar18[lVar16];
    uVar22 = (ulong)(char)bVar21;
    if (uVar22 == 0x23) {
      cVar8 = '#';
      while ((cVar8 != '\n' && (cVar8 != '\r'))) {
        lVar14 = lVar16 + 1;
        lVar16 = lVar16 + 1;
        cVar8 = pcVar18[lVar14];
      }
      lVar14 = lVar16 + 1;
      if ((pcVar18[lVar16 + 1] == '\n') || (pcVar18[lVar16 + 1] == '\r')) {
LAB_004a1372:
        lVar16 = lVar14;
      }
    }
    else {
      ppuVar10 = __ctype_b_loc();
      uVar1 = (*ppuVar10)[uVar22];
      if ((uVar1 & 8) == 0) {
        if (0x2d < bVar21) {
LAB_004a1858:
          if ((uVar1 >> 0xe & 1) == 0) {
            pcVar18 = "parasail_matrix_from_file: non-printing character in matrix file (\'%d\')\n";
          }
          else {
            pcVar18 = "parasail_matrix_from_file: non-alpha character in matrix file (\'%c\')\n";
          }
          fprintf(_stderr,pcVar18,uVar22 & 0xffffffff);
          if (__s != (char *)0x0) {
            free(__s);
          }
          if (local_a0 != (int *)0x0) {
            free(local_a0);
          }
          if (local_b0 != (int *)0x0) {
            free(local_b0);
          }
LAB_004a166e:
          parasail_close(pf);
          return (parasail_matrix_t *)0x0;
        }
        uVar17 = (ulong)(uint)bVar21;
        if ((0x2400UL >> (uVar17 & 0x3f) & 1) == 0) {
          if ((0x100000200U >> (uVar17 & 0x3f) & 1) == 0) {
            if ((0x240000000000U >> (uVar17 & 0x3f) & 1) == 0) goto LAB_004a1858;
            goto LAB_004a121d;
          }
        }
        else {
          lVar14 = lVar16 + 1;
          if ((lVar14 < lVar2) && ((pcVar18[lVar14] == '\r' || (pcVar18[lVar14] == '\n'))))
          goto LAB_004a1372;
        }
      }
      else {
LAB_004a121d:
        if (bVar6) {
          lVar19 = 0;
          lVar14 = lVar16;
          do {
            bVar21 = pcVar18[lVar14];
            uVar22 = (ulong)bVar21;
            if (uVar22 < 0x24) {
              if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) {
                if ((0x800002400U >> (uVar22 & 0x3f) & 1) == 0) goto LAB_004a1255;
                break;
              }
            }
            else {
LAB_004a1255:
              if ((bVar21 != 0x2a) && (((*ppuVar10)[(char)bVar21] & 0x400) == 0)) goto LAB_004a17f2;
              lVar19 = lVar19 + 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar2 != lVar14);
          if (lVar19 == 0) {
LAB_004a17f2:
            parasail_matrix_from_file_internal_cold_3();
            return (parasail_matrix_t *)0x0;
          }
          __s = (char *)malloc(lVar19 + 1);
          if (__s == (char *)0x0) {
            perror("malloc");
            goto LAB_004a17f2;
          }
          lVar19 = 0;
          lVar14 = lVar16;
          do {
            bVar21 = pcVar18[lVar14];
            uVar22 = (ulong)bVar21;
            if (uVar22 < 0x24) {
              if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) {
                if ((0x800002400U >> (uVar22 & 0x3f) & 1) == 0) goto LAB_004a12c6;
                break;
              }
            }
            else {
LAB_004a12c6:
              if ((bVar21 != 0x2a) && (((*ppuVar10)[(char)bVar21] & 0x400) == 0)) goto LAB_004a17f2;
              __s[lVar19] = bVar21;
              lVar19 = lVar19 + 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar2 != lVar14);
          __s[lVar19] = '\0';
          local_98 = strlen(__s);
          local_50 = local_98 * local_98;
          local_b0 = (int *)malloc(local_50 * 4);
          if (local_b0 == (int *)0x0) {
            parasail_matrix_from_file_internal_cold_2();
            return (parasail_matrix_t *)0x0;
          }
          local_a0 = (int *)malloc(local_98 + 1);
          if (local_a0 == (int *)0x0) {
            parasail_matrix_from_file_internal_cold_1();
            return (parasail_matrix_t *)0x0;
          }
          for (; (pcVar18[lVar16] != '\n' && (pcVar18[lVar16] != '\r')); lVar16 = lVar16 + 1) {
          }
          bVar6 = false;
          local_80 = local_98;
          if ((pcVar18[lVar16 + 1] == '\n') || (pcVar18[lVar16 + 1] == '\r')) {
            lVar16 = lVar16 + 1;
          }
        }
        else {
          if (local_80 <= local_68) {
            local_a0 = (int *)realloc(local_a0,local_80 * 2 + 1);
            if (local_a0 == (int *)0x0) {
              parasail_matrix_from_file_internal_cold_4();
              return (parasail_matrix_t *)0x0;
            }
            local_80 = local_80 * 2;
            bVar21 = pcVar18[lVar16];
            uVar1 = (*ppuVar10)[(char)bVar21];
          }
          local_58 = local_58 + 1;
          bVar15 = bVar21;
          if ((uVar1 >> 10 & 1) == 0) {
            bVar15 = 0x2a;
          }
          lVar16 = lVar16 + (ulong)(bVar21 == 0x2a | (byte)(uVar1 >> 10) & 1);
          *(byte *)((long)local_a0 + local_68) = bVar15;
          local_68 = local_68 + 1;
          bVar6 = false;
          if (local_98 == 0) {
            local_98 = 0;
          }
          else {
            local_38 = local_98 + uVar20;
            do {
              uVar22 = local_50;
              local_6c = 0;
              for (lVar14 = lVar16; (cVar8 = pcVar18[lVar14], cVar8 == ' ' || (cVar8 == '\t'));
                  lVar14 = lVar14 + 1) {
              }
              puVar3 = *ppuVar10;
              if ((cVar8 != '-') && ((puVar3[cVar8] & 0x800) == 0)) {
LAB_004a1641:
                parasail_matrix_from_file_internal_cold_5();
                uVar20 = extraout_RAX;
LAB_004a165d:
                if ((uVar20 & 1) == 0) {
                  free(local_b0);
                }
                goto LAB_004a166e;
              }
              lVar19 = 1;
              while (local_42[0] = cVar8,
                    (*(byte *)((long)puVar3 + (long)pcVar18[lVar19 + lVar14] * 2 + 1) & 8) != 0) {
                local_42[lVar19] = pcVar18[lVar19 + lVar14];
                lVar19 = lVar19 + 1;
                if (lVar19 == 10) goto LAB_004a1641;
              }
              local_42[lVar19] = '\0';
              iVar9 = __isoc99_sscanf(local_42,"%d",&local_6c);
              if (iVar9 != 1) goto LAB_004a1641;
              if (uVar22 <= uVar20) {
                local_b0 = (int *)realloc(local_b0,uVar22 * 8);
                if (local_b0 != (int *)0x0) {
                  local_50 = uVar22 * 2;
                  goto LAB_004a1506;
                }
                parasail_matrix_from_file_internal_cold_6();
                uVar20 = extraout_RAX_00;
                local_b0 = local_a0;
                goto LAB_004a165d;
              }
LAB_004a1506:
              lVar16 = lVar19 + lVar14;
              local_b0[uVar20] = local_6c;
              uVar20 = uVar20 + 1;
              if (local_84 < local_6c) {
                local_84 = local_6c;
              }
              if (local_6c < local_88) {
                local_88 = local_6c;
              }
            } while (uVar20 != local_38);
            bVar6 = false;
            lVar16 = lVar14 + lVar19;
            uVar20 = local_38;
          }
        }
      }
    }
    lVar16 = lVar16 + 1;
    if (lVar2 <= lVar16) {
      parasail_close(pf);
      sVar7 = local_68;
      *(undefined1 *)((long)local_a0 + local_68) = 0;
      if ((local_98 == local_68) && (iVar9 = strcmp(__s,(char *)local_a0), iVar9 == 0)) {
        if (uVar20 != sVar7 * sVar7) {
          parasail_matrix_from_file_internal_cold_8();
          return (parasail_matrix_t *)0x0;
        }
        iVar9 = 0;
        if (local_58 != sVar7) {
          parasail_matrix_from_file_internal_cold_9();
          return (parasail_matrix_t *)0x0;
        }
      }
      else {
        iVar9 = 1;
        if (uVar20 != local_98 * local_58) {
          parasail_matrix_from_file_internal_cold_7();
          return (parasail_matrix_t *)0x0;
        }
      }
      sVar7 = local_58;
      b = (int *)malloc(0x400);
      if (b == (int *)0x0) {
        parasail_matrix_from_file_internal_cold_11();
      }
      else {
        parasail_memset_int(b,(int)local_98 + -1,0x100);
        if (local_48 == 0) {
          if (local_98 != 0) {
            pp_Var12 = __ctype_toupper_loc();
            p_Var4 = *pp_Var12;
            pp_Var12 = __ctype_tolower_loc();
            p_Var5 = *pp_Var12;
            sVar11 = 0;
            do {
              b[p_Var4[(byte)__s[sVar11]]] = (int)sVar11;
              b[p_Var5[(byte)__s[sVar11]]] = (int)sVar11;
              sVar11 = sVar11 + 1;
            } while (local_98 != sVar11);
          }
        }
        else if (local_98 != 0) {
          sVar11 = 0;
          do {
            b[(byte)__s[sVar11]] = (int)sVar11;
            sVar11 = sVar11 + 1;
          } while (local_98 != sVar11);
        }
        ppVar13 = (parasail_matrix_t *)malloc(0x48);
        if (ppVar13 != (parasail_matrix_t *)0x0) {
          ppVar13->name = local_60;
          ppVar13->matrix = local_b0;
          ppVar13->mapper = b;
          ppVar13->size = (int)local_98;
          ppVar13->max = local_84;
          ppVar13->min = local_88;
          ppVar13->user_matrix = local_b0;
          ppVar13->type = iVar9;
          ppVar13->length = (int)sVar7;
          ppVar13->alphabet = __s;
          ppVar13->query = (char *)local_a0;
          return ppVar13;
        }
        parasail_matrix_from_file_internal_cold_10();
      }
      return (parasail_matrix_t *)0x0;
    }
  } while( true );
}

Assistant:

static parasail_matrix_t* parasail_matrix_from_file_internal(const char *filename, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    size_t matrix_i = 0;
    size_t matrix_capacity = 0;
    int *mapper = NULL;
    char *alphabet = NULL;
    char *alphabet_query = NULL;
    size_t alphabet_query_i = 0;
    size_t alphabet_query_capacity = 0;
    parasail_file_t *pf = NULL;
    const char *T = NULL;
    off_t i = 0;
    off_t size = 0;
    int first_alpha = 1;
    size_t count = 0;
    size_t asize = 0;
    int max = INT_MIN;
    int min = INT_MAX;
    size_t c = 0;
    int type = PARASAIL_MATRIX_TYPE_SQUARE;

    if (NULL == filename) {
        fprintf(stderr, "parasail_matrix_from_file: NULL pointer\n");
        return NULL;
    }

    pf = parasail_open(filename);
    if (NULL == pf) {
        fprintf(stderr, "parasail_matrix_from_file: "
                "parasail_open(%s) failed\n", filename);
        return NULL;
    }
    T = pf->buf;
    size = pf->size;

    while (i<size) {
        if (T[i] == '#') {
            /* ignore comments */
            i = skip_line(T, i);
        }
        else if (isalnum(T[i]) || T[i] == '*' || T[i] == '-') {
            if (first_alpha) {
                first_alpha = 0;
                alphabet = get_alphabet(T, i, size);
                if (NULL == alphabet) {
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "poorly formed matrix file alphabet\n");
                    parasail_close(pf);
                    return NULL;
                }
                asize = strlen(alphabet);
                matrix_capacity = asize*asize;
                matrix = (int*)malloc(sizeof(int)*matrix_capacity);
                if (NULL == matrix) {
                    perror("malloc");
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "cannont malloc buffer for matrix\n");
                    free(alphabet);
                    parasail_close(pf);
                    return NULL;
                }
                alphabet_query_capacity = asize;
                alphabet_query = (char*)malloc(sizeof(char)*(alphabet_query_capacity+1));
                if (NULL == alphabet_query) {
                    perror("malloc");
                    fprintf(stderr, "parasail_matrix_from_file: "
                            "cannont malloc buffer for matrix alphabet\n");
                    free(matrix);
                    free(alphabet);
                    parasail_close(pf);
                    return NULL;
                }
                i = skip_line(T, i);
            }
            else {
                size_t j=0;
                /* store the letter */
                if (alphabet_query_i >= alphabet_query_capacity) {
                    alphabet_query_capacity *= 2;
                    alphabet_query = realloc(alphabet_query, sizeof(char)*(alphabet_query_capacity+1));
                    if (NULL == alphabet_query) {
                        perror("realloc");
                        fprintf(stderr, "parasail_matrix_from_file: "
                                "couldn't grow query size\n");
                        if (alphabet) free(alphabet);
                        if (alphabet_query) free(alphabet_query);
                        if (matrix) free(matrix);
                        parasail_close(pf);
                        return NULL;
                    }
                }
                ++count;
                /* allow PSSM matrix to omit query */
                if (isalpha(T[i]) || T[i] == '*') {
                    alphabet_query[alphabet_query_i++] = T[i];
                    ++i; /* skip over the letter */
                }
                else {
                    alphabet_query[alphabet_query_i++] = '*';
                    /* don't increment read index i */
                }
                for (j=0; j<asize; ++j) {
                    int val = 0;
                    int retcode = get_num(T, &i, &val);
                    if (-1 == retcode) {
                        fprintf(stderr, "parasail_matrix_from_file: "
                                "poorly formed matrix file\n");
                        if (alphabet) free(alphabet);
                        if (alphabet_query) free(alphabet_query);
                        if (matrix) free(matrix);
                        parasail_close(pf);
                        return NULL;
                    }
                    if (matrix_i >= matrix_capacity) {
                        matrix_capacity *= 2;
                        matrix = realloc(matrix, sizeof(int)*matrix_capacity);
                        if (NULL == matrix) {
                            perror("realloc");
                            fprintf(stderr, "parasail_matrix_from_file: "
                                    "couldn't grow matrix size\n");
                            if (alphabet) free(alphabet);
                            if (alphabet_query) free(alphabet_query);
                            if (matrix) free(matrix);
                            parasail_close(pf);
                            return NULL;
                        }
                    }
                    matrix[matrix_i++] = val;
                    max = val > max ? val : max;
                    min = val < min ? val : min;
                }
            }
        }
        else if (T[i] == '\n' || T[i] == '\r') {
            /* ignore newline */
            /* for the case of "\r\n" or "\n\r" */
            if (i+1<size && (T[i+1] == '\n' || T[i+1] == '\r')) {
                ++i;
            }
        }
        else if (T[i] == ' ' || T[i] == '\t') {
            /* ignore spaces and tabs */
        }
        else if (isprint(T[i])) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "non-alpha character in matrix file ('%c')\n", T[i]);
            if (alphabet) free(alphabet);
            if (alphabet_query) free(alphabet_query);
            if (matrix) free(matrix);
            parasail_close(pf);
            return NULL;
        }
        else {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "non-printing character in matrix file ('%d')\n", T[i]);
            if (alphabet) free(alphabet);
            if (alphabet_query) free(alphabet_query);
            if (matrix) free(matrix);
            parasail_close(pf);
            return NULL;
        }
        ++i;
    }

    parasail_close(pf);

    /* we consider this a square matrix if alphabet sizes match and are identical */
    alphabet_query[alphabet_query_i] = '\0';
    if (asize == alphabet_query_i && 0 == strcmp(alphabet, alphabet_query)) {
        /* square */
        if (matrix_i != asize*asize) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing values\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
        if (count != asize) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing rows\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
    }
    else {
        /* PSSM */
        type = PARASAIL_MATRIX_TYPE_PSSM;
        if (matrix_i != asize*count) {
            fprintf(stderr, "parasail_matrix_from_file: "
                    "matrix is missing values\n");
            free(alphabet);
            free(alphabet_query);
            free(matrix);
            return NULL;
        }
    }

    mapper = (int*)malloc(sizeof(int)*256);
    if (NULL == mapper) {
        perror("malloc");
        fprintf(stderr, "parasail_matrix_from_file: "
                "cannont malloc mapper buffer for matrix file `%s'\n",
                filename);
        free(alphabet);
        free(alphabet_query);
        free(matrix);
        return NULL;
    }
    parasail_memset_int(mapper, asize-1, 256);
    if (case_sensitive) {
        for (c=0; c<asize; ++c) {
            mapper[(unsigned char)alphabet[c]] = (int)c;
        }
    }
    else {
        for (c=0; c<asize; ++c) {
            mapper[toupper((unsigned char)alphabet[c])] = (int)c;
            mapper[tolower((unsigned char)alphabet[c])] = (int)c;
        }
    }

    retval = (parasail_matrix_t*)malloc(sizeof(parasail_matrix_t));
    if (NULL == retval) {
        perror("malloc");
        fprintf(stderr, "parasail_matrix_from_file: "
                "cannont malloc buffer for matrix file `%s'\n", filename);
        free(matrix);
        return NULL;
    }

    retval->name = filename;
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)asize;
    retval->max = max;
    retval->min = min;
    retval->user_matrix = matrix;
    retval->type = type;
    retval->length = (int)count;
    retval->alphabet = alphabet;
    retval->query = alphabet_query;
    return retval;
}